

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::
Destroyer<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
::nodesDoNotDeallocate
          (Destroyer<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
           *this,Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *m)

{
  Node *pNVar1;
  void *pvVar2;
  long *plVar3;
  undefined1 auVar4 [16];
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  
  m->mNumElements = 0;
  uVar6 = m->mMask + 1;
  if (uVar6 < 0x28f5c28f5c28f5d) {
    uVar7 = (uVar6 * 0x50) / 100;
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar6 >> 2;
    uVar7 = (SUB168(auVar4 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0x3ffffffffffffffc) * 0x14;
  }
  uVar9 = 0xff;
  if (uVar7 < 0xff) {
    uVar9 = uVar7;
  }
  if (uVar9 + uVar6 != 0) {
    lVar10 = 0x38;
    lVar8 = 0;
    do {
      if (m->mInfo[lVar8] != '\0') {
        pNVar1 = m->mKeyVals;
        std::vector<Rml::KeyframeBlock,_std::allocator<Rml::KeyframeBlock>_>::~vector
                  ((vector<Rml::KeyframeBlock,_std::allocator<Rml::KeyframeBlock>_> *)
                   ((long)&(pNVar1->mData).first._M_dataplus._M_p + lVar10));
        pvVar2 = *(void **)((long)pNVar1 + lVar10 + -0x18);
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2,*(long *)((long)pNVar1 + lVar10 + -8) - (long)pvVar2);
        }
        plVar5 = (long *)((long)pNVar1 + lVar10 + -0x28);
        plVar3 = *(long **)((long)pNVar1 + lVar10 + -0x38);
        if (plVar5 != plVar3) {
          operator_delete(plVar3,*plVar5 + 1);
        }
      }
      lVar8 = lVar8 + 1;
      lVar10 = lVar10 + 0x50;
    } while (uVar9 + uVar6 != lVar8);
  }
  return;
}

Assistant:

void nodesDoNotDeallocate(M& m) const noexcept {
            m.mNumElements = 0;
            // clear also resets mInfo to 0, that's sometimes not necessary.
            auto const numElementsWithBuffer = m.calcNumElementsWithBuffer(m.mMask + 1);
            for (size_t idx = 0; idx < numElementsWithBuffer; ++idx) {
                if (0 != m.mInfo[idx]) {
                    Node& n = m.mKeyVals[idx];
                    n.destroyDoNotDeallocate();
                    n.~Node();
                }
            }
        }